

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O0

void __thiscall PolyFit<double>::dataToEigen(PolyFit<double> *this)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  Scalar *pSVar4;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *rows;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  int local_10;
  int local_c;
  
  rows = in_RDI + 0x9e8;
  std::vector<double,_std::allocator<double>_>::size
            (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9d8));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI,(Index)rows,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::vector<double,_std::allocator<double>_>::size
            (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9e0));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI,(Index)rows,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  local_c = 0;
  while( true ) {
    iVar5 = local_c;
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9d8));
    if ((int)sVar2 <= iVar5) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9d8),(long)local_c)
    ;
    vVar1 = *pvVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_RDI,(Index)rows,CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    *pSVar4 = vVar1;
    local_c = local_c + 1;
  }
  local_10 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9e0));
    if ((int)sVar2 <= local_10) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9e0),(long)local_10
                       );
    vVar1 = *pvVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_RDI,(Index)rows,CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    *pSVar4 = vVar1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void dataToEigen(void)
    {
      xM.resize(static_cast<int>(x.size()),1);
      yM.resize(static_cast<int>(y.size()),1);

      for (int i=0;i<static_cast<int>(x.size()); ++i)
        xM(i,0) = x[i];

      for (int i=0;i<static_cast<int>(y.size()); ++i)
        yM(i,0) = y[i];
    }